

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int helicsDataBufferStringSize(HelicsDataBuffer data)

{
  DataType DVar1;
  byte *data_00;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar3;
  string v;
  SmallBuffer *ptr;
  string *in_stack_00000150;
  DataType in_stack_0000015c;
  data_view *in_stack_00000160;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  SmallBuffer *in_stack_ffffffffffffffa8;
  data_view *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SmallBuffer *local_18;
  int local_4;
  
  local_18 = getBuffer((HelicsDataBuffer)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (local_18 == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    helics::SmallBuffer::data(local_18);
    DVar1 = helics::detail::detectType((byte *)in_stack_ffffffffffffffa8);
    if (DVar1 == HELICS_UNKNOWN) {
      sVar2 = helics::SmallBuffer::size(local_18);
      local_4 = (int)sVar2;
    }
    else if (DVar1 == HELICS_STRING) {
      data_00 = helics::SmallBuffer::data(local_18);
      sVar2 = helics::detail::getDataSize(data_00);
      local_4 = (int)sVar2 + 1;
    }
    else if (DVar1 == HELICS_CHAR) {
      local_4 = 1;
    }
    else {
      std::__cxx11::string::string(in_stack_ffffffffffffffa0);
      helics::data_view::data_view(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             helics::SmallBuffer::data(local_18);
      helics::detail::detectType((byte *)in_stack_ffffffffffffffa8);
      helics::valueExtract(in_stack_00000160,in_stack_0000015c,in_stack_00000150);
      helics::data_view::~data_view((data_view *)0x1f4568);
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&local_38);
      local_4 = (int)sVar3 + 1;
      std::__cxx11::string::~string(this);
    }
  }
  return local_4;
}

Assistant:

int helicsDataBufferStringSize(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    switch (helics::detail::detectType(ptr->data())) {
        case helics::DataType::HELICS_STRING:
            return static_cast<int>(helics::detail::getDataSize(ptr->data())) + 1;
        case helics::DataType::HELICS_CHAR:
            return 1;
        case helics::DataType::HELICS_UNKNOWN:
            return static_cast<int>(ptr->size());
        default: {
            std::string v;
            helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);
            return static_cast<int>(v.size()) + 1;
        } break;
    }
}